

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O3

ostream * operator<<(ostream *stream,buffer *buffer)

{
  byte *pbVar1;
  byte *pbVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"[",1);
  *(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x18) =
       *(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x18) & 0xffffffb5 | 8;
  pbVar2 = (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pbVar2 != (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      std::ostream::operator<<((ostream *)stream,(uint)*pbVar2);
      pbVar1 = (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pbVar2 != pbVar1 + -1) {
        std::__ostream_insert<char,std::char_traits<char>>(stream,", ",2);
        pbVar1 = (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_finish;
      }
      pbVar2 = pbVar2 + 1;
    } while (pbVar2 != pbVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"]",1);
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const buffer& buffer)
{
    stream << "[" << std::hex;

    for(auto it = buffer.begin(); it != buffer.end(); ++it)
    {
        stream << static_cast<int>(*it);
        if(it != buffer.end() - 1)
        {
            stream << ", ";
        }
    }

    return stream << "]";
}